

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__decode_uint8_linear_scaled_ABGR(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [15];
  undefined1 auVar5 [14];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [14];
  undefined1 auVar21 [13];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  uint6 uVar24;
  undefined1 (*pauVar25) [16];
  byte *pbVar26;
  float *decode;
  float *pfVar27;
  undefined1 (*pauVar28) [16];
  float *pfVar29;
  uint uVar30;
  
  pfVar2 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    if (3 < width_times_channels) {
      pfVar27 = decodep + 4;
      pbVar26 = (byte *)((long)inputp + 3);
      do {
        pfVar27[-4] = (float)*pbVar26 * 0.003921569;
        pfVar27[-3] = (float)pbVar26[-1] * 0.003921569;
        pfVar27[-2] = (float)pbVar26[-2] * 0.003921569;
        pfVar27[-1] = (float)pbVar26[-3] * 0.003921569;
        pfVar27 = pfVar27 + 4;
        pbVar26 = pbVar26 + 4;
      } while (pfVar27 <= pfVar2);
    }
  }
  else {
    pfVar27 = pfVar2 + -0x10;
    pauVar25 = (undefined1 (*) [16])inputp;
    do {
      pfVar1 = decodep + 0x10;
      pfVar29 = pfVar27;
      pauVar28 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels + -0x10);
      if (pfVar1 == pfVar2) {
        pfVar29 = pfVar1;
        pauVar28 = pauVar25 + 1;
      }
      if (pfVar1 <= pfVar27) {
        pauVar28 = pauVar25 + 1;
      }
      auVar3 = *pauVar25;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar3._0_13_;
      auVar4[0xe] = auVar3[7];
      auVar6[0xc] = auVar3[6];
      auVar6._0_12_ = auVar3._0_12_;
      auVar6._13_2_ = auVar4._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar3._0_11_;
      auVar7._12_3_ = auVar6._12_3_;
      uVar30 = auVar7._11_4_;
      auVar8[10] = auVar3[5];
      auVar8._0_10_ = auVar3._0_10_;
      auVar8._11_4_ = uVar30;
      auVar13[9] = 0;
      auVar13._0_9_ = auVar3._0_9_;
      auVar13._10_5_ = auVar8._10_5_;
      auVar14[8] = auVar3[4];
      auVar14._0_8_ = auVar3._0_8_;
      auVar14._9_6_ = auVar13._9_6_;
      auVar17._7_8_ = 0;
      auVar17._0_7_ = auVar14._8_7_;
      Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar3[3]);
      auVar22._9_6_ = 0;
      auVar22._0_9_ = Var18;
      auVar19._1_10_ = SUB1510(auVar22 << 0x30,5);
      auVar19[0] = auVar3[2];
      auVar23._11_4_ = 0;
      auVar23._0_11_ = auVar19;
      auVar15[2] = auVar3[1];
      auVar15._0_2_ = auVar3._0_2_;
      auVar15._3_12_ = SUB1512(auVar23 << 0x20,3);
      auVar16._2_13_ = auVar15._2_13_;
      auVar16._0_2_ = auVar3._0_2_ & 0xff;
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar16._0_10_;
      auVar5._12_2_ = (short)Var18;
      uVar24 = CONCAT42(auVar5._10_4_,auVar19._0_2_);
      auVar20._6_8_ = 0;
      auVar20._0_6_ = uVar24;
      auVar9._4_2_ = auVar15._2_2_;
      auVar9._0_4_ = auVar16._0_4_;
      auVar9._6_8_ = SUB148(auVar20 << 0x40,6);
      *decodep = (float)(auVar5._10_4_ >> 0x10) * 0.003921569;
      decodep[1] = (float)(int)uVar24 * 0.003921569;
      decodep[2] = (float)auVar9._4_4_ * 0.003921569;
      decodep[3] = (float)(auVar16._0_4_ & 0xffff) * 0.003921569;
      decodep[4] = (float)(uVar30 >> 0x18) * 0.003921569;
      decodep[5] = (float)(uVar30 >> 8 & 0xffff) * 0.003921569;
      decodep[6] = (float)auVar8._10_2_ * 0.003921569;
      decodep[7] = (float)auVar14._8_2_ * 0.003921569;
      uVar30 = CONCAT13(0,CONCAT12(auVar3[9],(ushort)auVar3[8]));
      auVar10[0xc] = auVar3[0xb];
      auVar10._0_12_ = ZEXT112(auVar3[0xc]) << 0x40;
      auVar11._10_3_ = auVar10._10_3_;
      auVar11._0_10_ = (unkuint10)auVar3[10] << 0x40;
      auVar21._5_8_ = 0;
      auVar21._0_5_ = auVar11._8_5_;
      auVar12[4] = auVar3[9];
      auVar12._0_4_ = uVar30;
      auVar12[5] = 0;
      auVar12._6_7_ = SUB137(auVar21 << 0x40,6);
      decodep[8] = (float)(uint3)(auVar10._10_3_ >> 0x10) * 0.003921569;
      decodep[9] = (float)auVar11._8_4_ * 0.003921569;
      decodep[10] = (float)auVar12._4_4_ * 0.003921569;
      decodep[0xb] = (float)(uVar30 & 0xffff) * 0.003921569;
      if (pfVar1 <= pfVar27) {
        pfVar29 = pfVar1;
      }
      decodep[0xc] = (float)auVar3[0xf] * 0.003921569;
      decodep[0xd] = (float)auVar3[0xe] * 0.003921569;
      decodep[0xe] = (float)auVar3[0xd] * 0.003921569;
      decodep[0xf] = (float)auVar3[0xc] * 0.003921569;
      pauVar25 = pauVar28;
      decodep = pfVar29;
    } while (pfVar1 != pfVar2);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__decode_uint8_linear_scaled )( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const*)inputp;

  #ifdef STBIR_SIMD
  unsigned char const * end_input_m16 = input + width_times_channels - 16;
  if ( width_times_channels >= 16 )
  {
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o0,o1;
      stbir__simdf8 of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u8_to_u32( o0, o1, i );
      stbir__simdi8_convert_i32_to_float( of0, o0 );
      stbir__simdi8_convert_i32_to_float( of1, o1 );
      stbir__simdf8_mult( of0, of0, STBIR_max_uint8_as_float_inverted8);
      stbir__simdf8_mult( of1, of1, STBIR_max_uint8_as_float_inverted8);
      stbir__decode_simdf8_flip( of0 );
      stbir__decode_simdf8_flip( of1 );
      stbir__simdf8_store( decode + 0, of0 );
      stbir__simdf8_store( decode + 8, of1 );
      #else
      stbir__simdi i, o0, o1, o2, o3;
      stbir__simdf of0, of1, of2, of3;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u8_to_u32( o0,o1,o2,o3,i);
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdi_convert_i32_to_float( of2, o2 );
      stbir__simdi_convert_i32_to_float( of3, o3 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of2, of2, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__simdf_mult( of3, of3, STBIR__CONSTF(STBIR_max_uint8_as_float_inverted) );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__decode_simdf4_flip( of2 );
      stbir__decode_simdf4_flip( of3 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      stbir__simdf_store( decode + 8,  of2 );
      stbir__simdf_store( decode + 12, of3 );
      #endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint8_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint8_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint8_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint8_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}